

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

int ON_String::MapString
              (ON_Locale *locale,ON_StringMapType map_type,char *string,int element_count,
              char *mapped_string,int mapped_string_capacity)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  wchar_t *sWideChar;
  char *pcVar7;
  uint unaff_EBP;
  ON_StringMapOrdinalType map_type_00;
  ON_wString wide_string;
  ON_wString wide_mapped_string;
  
  if (mapped_string_capacity < 0) {
    pcVar7 = "mapped_string_capacity is < 0.";
    iVar4 = 0xa4b;
  }
  else {
    if (mapped_string_capacity == 0) {
      mapped_string = (char *)0x0;
    }
    else {
      if (mapped_string == (char *)0x0) {
        pcVar7 = "mapped_string is nullptr.";
        iVar4 = 0xa55;
        goto LAB_005c66f8;
      }
      if (string != mapped_string) {
        *mapped_string = '\0';
      }
    }
    if ((element_count < 0) && (element_count = Length(string), element_count < 0)) {
      return 0;
    }
    if (element_count == 0) {
      return 1;
    }
    if (string != (char *)0x0) {
      bVar2 = ON_Locale::IsOrdinal(locale);
      if (bVar2) {
        if (mapped_string_capacity == 0) {
          return element_count;
        }
      }
      else {
        pcVar5 = string + (uint)element_count;
        pcVar7 = string;
        do {
          pcVar6 = pcVar7;
          uVar3 = element_count;
          if (pcVar5 <= pcVar6) break;
          cVar1 = *pcVar6;
          uVar3 = unaff_EBP;
          if (cVar1 < '\0') {
            ON_wString::ON_wString(&wide_string,string,element_count);
            ON_wString::MapString
                      (&wide_mapped_string,(ON_Locale *)&wide_string,(ON_StringMapType)locale);
            sWideChar = ON_wString::operator_cast_to_wchar_t_(&wide_mapped_string);
            iVar4 = ON_wString::Length(&wide_mapped_string);
            uVar3 = ON_ConvertWideCharToUTF8
                              (0,sWideChar,iVar4,mapped_string,mapped_string_capacity,(uint *)0x0,0,
                               0,(wchar_t **)0x0);
            if ((mapped_string_capacity == 0) ||
               (iVar4 = ON_wString::Length(&wide_mapped_string), iVar4 <= mapped_string_capacity)) {
              if ((int)uVar3 < mapped_string_capacity && pcVar5[-1] == '\0') {
                mapped_string[(int)uVar3] = '\0';
                uVar3 = uVar3 + 1;
              }
            }
            else {
              uVar3 = 0;
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_compare.cpp"
                         ,0xa8b,"","mapped_string_capacity too small.");
            }
            ON_wString::~ON_wString(&wide_mapped_string);
            ON_wString::~ON_wString(&wide_string);
          }
          pcVar7 = pcVar6 + 1;
          unaff_EBP = uVar3;
        } while (-1 < cVar1);
        if (mapped_string_capacity == 0 || pcVar6 < pcVar5) {
          return uVar3;
        }
      }
      if (map_type == LowerCase) {
        map_type_00 = LowerOrdinal;
      }
      else {
        if (map_type != UpperCase) {
          pcVar7 = "invalid map_type.";
          iVar4 = 0xaac;
          goto LAB_005c66f8;
        }
        map_type_00 = UpperOrdinal;
      }
      iVar4 = MapStringOrdinal(map_type_00,string,element_count,mapped_string,mapped_string_capacity
                              );
      return iVar4;
    }
    pcVar7 = "string is nullptr.";
    iVar4 = 0xa6a;
  }
LAB_005c66f8:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_compare.cpp"
             ,iVar4,"",pcVar7);
  return 0;
}

Assistant:

int ON_String::MapString(
  const class ON_Locale& locale,
  ON_StringMapType map_type,
  const char* string,
  int element_count,
  char* mapped_string,
  int mapped_string_capacity
  )
{
  if (mapped_string_capacity < 0)
  {
    ON_ERROR("mapped_string_capacity is < 0.");
    return 0;
  }

  if (0 == mapped_string_capacity)
    mapped_string = nullptr;
  else if (mapped_string_capacity > 0)
  {
    if (nullptr == mapped_string)
    {
      ON_ERROR("mapped_string is nullptr.");
      return 0;
    }
    if ( string != mapped_string )
      mapped_string[0] = 0;
  }

  if (element_count < 0)
  {
    element_count = ON_String::Length(string);
    if (element_count < 0 )
      return 0; // string has more than max int elements - probably missing a null terminator.
  }

  if ( 0 == element_count)
  {
    return 1;
  }

  if (nullptr == string)
  {
    ON_ERROR("string is nullptr.");
    return 0;
  }

  if (false == locale.IsOrdinal())
  {
    const char* s = string;
    const char* s1 = s + element_count;
    while (s < s1)
    {
      char c = *s++;
      if (c >= 0 && c <= 127)
        continue;

      // UTF-8 multi char element code point
      // No robust UTF-8 tools are available from the Windows or Mac API.
      // TODO - investigate using ICU to avoid UTF-8 -> wide char -> UTF-8 conversion
      const ON_wString wide_string(string, element_count);
      const ON_wString wide_mapped_string = wide_string.MapString(locale, map_type);
      int mapped_element_count = ON_ConvertWideCharToUTF8(
        false, // bTestByteOrder
        static_cast<const wchar_t*>(wide_mapped_string),
        wide_mapped_string.Length(),
        mapped_string,
        mapped_string_capacity,
        nullptr,
        0,
        0,
        nullptr
        );

      if (mapped_string_capacity > 0 && wide_mapped_string.Length() > mapped_string_capacity)
      {
        ON_ERROR("mapped_string_capacity too small.");
        return 0;
      }

      if (0 == string[element_count - 1] && mapped_element_count < mapped_string_capacity)
      {
        if (mapped_element_count < mapped_string_capacity)
        {
          mapped_string[mapped_element_count] = 0;
          mapped_element_count++; // count the null terminator
        }
        else
        {
          ON_ERROR("mapped_string_capacity too small.");
          return 0;
        }
      }
      return mapped_element_count;
    }
  }

  if ( 0 == mapped_string_capacity )
    return element_count;

  switch (map_type)
  {
  case ON_StringMapType::UpperCase:
    return ON_String::MapStringOrdinal(ON_StringMapOrdinalType::UpperOrdinal,string,element_count,mapped_string,mapped_string_capacity);
    break;
  case ON_StringMapType::LowerCase:
    return ON_String::MapStringOrdinal(ON_StringMapOrdinalType::LowerOrdinal,string,element_count,mapped_string,mapped_string_capacity);
    break;
  default:
    ON_ERROR("invalid map_type.");
    break;
  }

  return 0;
}